

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cc
# Opt level: O0

void avro::assertType(Entity *e,EntityType et)

{
  EntityType EVar1;
  undefined8 uVar2;
  EntityType in_ESI;
  Entity *in_RDI;
  EntityType *in_stack_fffffffffffffed8;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  format *in_stack_ffffffffffffff18;
  Exception *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff48;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  
  EVar1 = json::Entity::type(in_RDI);
  if (EVar1 != in_ESI) {
    uVar2 = __cxa_allocate_exception(0x18);
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    json::Entity::type(in_RDI);
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    Exception::Exception(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
  }
  return;
}

Assistant:

static void assertType(const Entity& e, EntityType et)
{
    if (e.type() != et) {
        throw Exception(boost::format("Unexpected type for default value: "
            "Expected %1%, but found %2%") % et % e.type());
    }
}